

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

bool __thiscall GGWave::computeFFTR(GGWave *this,float *src,float *dst,int N)

{
  uint uVar1;
  
  uVar1 = this->m_samplesPerFrame;
  if (uVar1 == N) {
    anon_unknown.dwarf_1e7f::FFT
              (src,dst,N,(this->m_rx).fftWorkI.m_data,(this->m_rx).fftWorkF.m_data);
  }
  else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
    fprintf((anonymous_namespace)::g_fptr,
            "computeFFTR: N (%d) must be equal to \'samplesPerFrame\' %d\n",(ulong)(uint)N,
            (ulong)uVar1);
  }
  return uVar1 == N;
}

Assistant:

bool GGWave::computeFFTR(const float * src, float * dst, int N) {
    if (N != m_samplesPerFrame) {
        ggprintf("computeFFTR: N (%d) must be equal to 'samplesPerFrame' %d\n", N, m_samplesPerFrame);
        return false;
    }

    FFT(src, dst, N, m_rx.fftWorkI.data(), m_rx.fftWorkF.data());

    return true;
}